

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O0

void tcmalloc_backtrace_qsort
               (void *basearg,size_t count,size_t size,_func_int_void_ptr_void_ptr *compar)

{
  int iVar1;
  size_t local_40;
  size_t mid;
  size_t i;
  char *base;
  _func_int_void_ptr_void_ptr *compar_local;
  size_t size_local;
  size_t count_local;
  void *basearg_local;
  
  i = (size_t)basearg;
  size_local = count;
  while (1 < size_local) {
    swap((char *)i,(char *)(i + (size_local >> 1) * size),size);
    local_40 = 0;
    for (mid = 1; mid < size_local; mid = mid + 1) {
      iVar1 = (*compar)((void *)i,(void *)(i + mid * size));
      if ((0 < iVar1) && (local_40 = local_40 + 1, mid != local_40)) {
        swap((char *)(i + local_40 * size),(char *)(i + mid * size),size);
      }
    }
    if (local_40 != 0) {
      swap((char *)i,(char *)(i + local_40 * size),size);
    }
    if (local_40 << 1 < size_local) {
      tcmalloc_backtrace_qsort((void *)i,local_40,size,compar);
      i = (local_40 + 1) * size + i;
      size_local = size_local - (local_40 + 1);
    }
    else {
      tcmalloc_backtrace_qsort
                ((void *)(i + (local_40 + 1) * size),size_local - (local_40 + 1),size,compar);
      size_local = local_40;
    }
  }
  return;
}

Assistant:

void
backtrace_qsort (void *basearg, size_t count, size_t size,
		 int (*compar) (const void *, const void *))
{
  char *base = (char *) basearg;
  size_t i;
  size_t mid;

 tail_recurse:
  if (count < 2)
    return;

  /* The symbol table and DWARF tables, which is all we use this
     routine for, tend to be roughly sorted.  Pick the middle element
     in the array as our pivot point, so that we are more likely to
     cut the array in half for each recursion step.  */
  swap (base, base + (count / 2) * size, size);

  mid = 0;
  for (i = 1; i < count; i++)
    {
      if ((*compar) (base, base + i * size) > 0)
	{
	  ++mid;
	  if (i != mid)
	    swap (base + mid * size, base + i * size, size);
	}
    }

  if (mid > 0)
    swap (base, base + mid * size, size);

  /* Recurse with the smaller array, loop with the larger one.  That
     ensures that our maximum stack depth is log count.  */
  if (2 * mid < count)
    {
      backtrace_qsort (base, mid, size, compar);
      base += (mid + 1) * size;
      count -= mid + 1;
      goto tail_recurse;
    }
  else
    {
      backtrace_qsort (base + (mid + 1) * size, count - (mid + 1),
		       size, compar);
      count = mid;
      goto tail_recurse;
    }
}